

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O3

skynet_context * skynet_context_new(char *name,char *param)

{
  uint32_t uVar1;
  int iVar2;
  skynet_module *m;
  void *inst;
  skynet_context *ctx;
  message_queue *queue;
  skynet_context *context;
  char *pcVar3;
  drop_t d;
  undefined1 local_34 [4];
  
  m = skynet_module_query(name);
  if ((m != (skynet_module *)0x0) && (inst = skynet_module_instance_create(m), inst != (void *)0x0))
  {
    ctx = (skynet_context *)malloc(0x60);
    ctx->mod = m;
    ctx->instance = inst;
    ctx->ref = 2;
    ctx->logfile = (FILE *)0x0;
    ctx->init = false;
    ctx->endless = false;
    ctx->handle = 0;
    ctx->session_id = 0;
    ctx->cb_ud = (void *)0x0;
    ctx->cb = (skynet_cb)0x0;
    uVar1 = skynet_handle_register(ctx);
    ctx->handle = uVar1;
    queue = skynet_mq_create(uVar1);
    ctx->queue = queue;
    LOCK();
    G_NODE.total = G_NODE.total + 1;
    UNLOCK();
    iVar2 = skynet_module_instance_init(m,inst,ctx,param);
    if (iVar2 != 0) {
      skynet_error(ctx,"FAILED launch %s",name);
      uVar1 = ctx->handle;
      skynet_context_release(ctx);
      skynet_handle_retire(uVar1);
      skynet_mq_release(queue,drop_message,local_34);
      return (skynet_context *)0x0;
    }
    context = skynet_context_release(ctx);
    if (context != (skynet_context *)0x0) {
      ctx->init = true;
      skynet_globalmq_push(queue);
      pcVar3 = "";
      if (param != (char *)0x0) {
        pcVar3 = param;
      }
      skynet_error(context,"LAUNCH %s %s",name,pcVar3);
      return context;
    }
    skynet_globalmq_push(queue);
  }
  return (skynet_context *)0x0;
}

Assistant:

struct skynet_context * 
skynet_context_new(const char * name, const char *param) {
	struct skynet_module * mod = skynet_module_query(name);

	if (mod == NULL)
		return NULL;

	void *inst = skynet_module_instance_create(mod);
	if (inst == NULL)
		return NULL;
	struct skynet_context * ctx = skynet_malloc(sizeof(*ctx));
	CHECKCALLING_INIT(ctx)

	ctx->mod = mod;
	ctx->instance = inst;
	ctx->ref = 2;
	ctx->cb = NULL;
	ctx->cb_ud = NULL;
	ctx->session_id = 0;
	ctx->logfile = NULL;

	ctx->init = false;
	ctx->endless = false;
	// Should set to 0 first to avoid skynet_handle_retireall get an uninitialized handle
	ctx->handle = 0;	
	ctx->handle = skynet_handle_register(ctx);
	struct message_queue * queue = ctx->queue = skynet_mq_create(ctx->handle);
	// init function maybe use ctx->handle, so it must init at last
	context_inc();

	CHECKCALLING_BEGIN(ctx)
	int r = skynet_module_instance_init(mod, inst, ctx, param);
	CHECKCALLING_END(ctx)
	if (r == 0) {
		struct skynet_context * ret = skynet_context_release(ctx);
		if (ret) {
			ctx->init = true;
		}
		skynet_globalmq_push(queue);
		if (ret) {
			skynet_error(ret, "LAUNCH %s %s", name, param ? param : "");
		}
		return ret;
	} else {
		skynet_error(ctx, "FAILED launch %s", name);
		uint32_t handle = ctx->handle;
		skynet_context_release(ctx);
		skynet_handle_retire(handle);
		struct drop_t d = { handle };
		skynet_mq_release(queue, drop_message, &d);
		return NULL;
	}
}